

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O3

void __thiscall ui::anon_unknown_0::WiFiImpl::RefreshNetworkList(WiFiImpl *this)

{
  string *result;
  bool bVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  size_type *psVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unique_name;
  string name;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mac_address;
  string local_128;
  string local_108;
  string local_e8;
  WiFiImpl *local_c8;
  string local_c0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a0;
  string local_98;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = this;
  bVar1 = WifiStatus(this);
  if (!bVar1) {
    shell_helper("connmanctl enable wifi");
  }
  shell_helper("connmanctl scan wifi");
  result = &local_c8->result;
  shell_helper("cat /sys/class/net/wlan0/address | sed  -r \'s/^([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2})$/\\1\\2\\3\\4\\5\\6/\'"
               ,result);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)result);
  shell_helper("connmanctl services | sed -e \'s/[ \t]*//\'",result);
  std::operator+(&local_70,"wifi_",&local_50);
  local_a0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&local_c8->service_names;
  local_78 = (string *)&local_c8->active_name;
  do {
    if ((local_c8->result)._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    lVar2 = std::__cxx11::string::find((char *)result,0x15b4a9,0);
    if (lVar2 != -1) {
      std::__cxx11::string::find((char *)result,0x15b4a9,0);
      std::__cxx11::string::substr((ulong)&local_108,(ulong)result);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128," ","");
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," \t","");
      reduce(&local_c0,&local_108,&local_128,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      lVar2 = std::__cxx11::string::find((char *)&local_c0,(ulong)local_70._M_dataplus._M_p,0);
      if (lVar2 != -1) {
        if (lVar2 == 0) {
          std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_c0);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x1585ed);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          psVar6 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_108.field_2._M_allocated_capacity = *psVar6;
            local_108.field_2._8_8_ = plVar3[3];
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar6;
            local_108._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_108._M_string_length = plVar3[1];
          *plVar3 = (long)psVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_a0,&local_108);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_128.field_2._M_allocated_capacity;
          _Var8._M_p = local_128._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_001311e8:
            operator_delete(_Var8._M_p,uVar7 + 1);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_c0);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," ","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," \t","");
          reduce(&local_108,&local_128,&local_e8,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          uVar4 = std::__cxx11::string::find((char *)&local_108,0x1585ea,0);
          if (uVar4 != 0xffffffffffffffff) {
            std::__cxx11::string::find_first_of((char *)&local_108,0x157c9e,0);
            std::__cxx11::string::erase((ulong)&local_108,uVar4);
            std::__cxx11::string::_M_assign(local_78);
          }
          std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_c0);
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_a0,&local_108);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_108.field_2._M_allocated_capacity;
          _Var8._M_p = local_108._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_001311e8;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::erase((ulong)result,0);
  } while( true );
}

Assistant:

void RefreshNetworkList() {
    if (!WifiStatus()) {
      /* Enable wifi */
      shell_helper("connmanctl enable wifi");
    }

    /* Scan wifi */
    shell_helper("connmanctl scan wifi");

    /* Get mac address formatted into continuous string */
    shell_helper(
        "cat /sys/class/net/wlan0/address | sed  -r "
        "'s/^([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2})$/"
        "\\1\\2\\3\\4\\5\\6/'",
        &result);

    /* Get macaddress from trailing spaces */
    auto mac_address = result.substr(0, result.length() - 2);

    /* Get connman services */
    shell_helper("connmanctl services | sed -e 's/[ \t]*//'", &result);

    /* Temporary string to store wifi_macaddress*/
    auto temp_start = "wifi_" + mac_address;

    while (true) {
      if (result.length() == 0) {
        break;
      }

      /* Position of newline character */
      size_t newline_pos = 1;
      if (result.find("\n") != std::string::npos) {
        newline_pos = result.find("\n");

        /* Get current line from trimmed sub sequence */
        auto current_line = reduce(result.substr(0, newline_pos));

        /* Position of wifi_<macaddress> */
        auto pos = current_line.find(temp_start);

        /* Default check for std::string::npos */
        if (pos != std::string::npos) {
          /* pos==0 means that it is hidden and has no name*/
          if (pos != 0) {
            auto name = reduce(current_line.substr(0, pos));
            auto act_pos = name.find("*A");
            if (act_pos != std::string::npos) {
              name.erase(act_pos, act_pos + name.find_first_of(" ") + 1);
              active_name = name;
            }
            auto unique_name = current_line.substr(pos);
            service_names[name] = unique_name;
          } else {
            service_names["hidden - " + current_line.substr(0, 10)] =
                current_line;
          }
        } else {
        }
      }
      result.erase(0, newline_pos + 1);
    }
  }